

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool spirv_cross::CompilerGLSL::needs_enclose_expression(string *expr)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  uint uVar6;
  
  if (expr->_M_string_length == 0) {
    return false;
  }
  pbVar2 = (byte *)(expr->_M_dataplus)._M_p;
  bVar1 = *pbVar2;
  uVar5 = (ulong)bVar1;
  if ((uVar5 < 0x2e) && ((0x2c4200000000U >> (uVar5 & 0x3f) & 1) != 0)) {
    return true;
  }
  if (bVar1 == 0x7e) {
    return true;
  }
  iVar3 = 0;
  sVar4 = 1;
  do {
    uVar6 = (uint)uVar5;
    if (uVar6 < 0x5b) {
      if (uVar6 == 0x28) {
LAB_00137256:
        iVar3 = iVar3 + 1;
      }
      else {
        if (uVar6 == 0x29) goto LAB_0013725a;
LAB_00137262:
        if ((char)uVar5 == ' ' && iVar3 == 0) {
          return true;
        }
      }
    }
    else {
      if (uVar6 != 0x5d) {
        if (uVar6 != 0x5b) goto LAB_00137262;
        goto LAB_00137256;
      }
LAB_0013725a:
      if (iVar3 == 0) {
        __assert_fail("paren_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x1401,
                      "static bool spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                     );
      }
      iVar3 = iVar3 + -1;
    }
    if (expr->_M_string_length == sVar4) {
      if (iVar3 == 0) {
        return false;
      }
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x140a,
                    "static bool spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                   );
    }
    uVar5 = (ulong)pbVar2[sVar4];
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

bool CompilerGLSL::needs_enclose_expression(const std::string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	return need_parens;
}